

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

uint32_t __thiscall leveldb::Random::Next(Random *this)

{
  long lVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  uint32_t uVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (ulong)this->seed_ * 0x41a7;
  uVar4 = (uint)uVar5 & 0x7fffffff;
  iVar2 = (int)(uVar5 >> 0x1f);
  uVar6 = iVar2 + uVar4;
  uVar3 = iVar2 + uVar4 + 0x80000001;
  if (-1 < (int)uVar6) {
    uVar3 = uVar6;
  }
  this->seed_ = uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t Next() {
    static const uint32_t M = 2147483647L;  // 2^31-1
    static const uint64_t A = 16807;        // bits 14, 8, 7, 5, 2, 1, 0
    // We are computing
    //       seed_ = (seed_ * A) % M,    where M = 2^31-1
    //
    // seed_ must not be zero or M, or else all subsequent computed values
    // will be zero or M respectively.  For all other values, seed_ will end
    // up cycling through every number in [1,M-1]
    uint64_t product = seed_ * A;

    // Compute (product % M) using the fact that ((x << 31) % M) == x.
    seed_ = static_cast<uint32_t>((product >> 31) + (product & M));
    // The first reduction may overflow by 1 bit, so we may need to
    // repeat.  mod == M is not possible; using > allows the faster
    // sign-bit-based test.
    if (seed_ > M) {
      seed_ -= M;
    }
    return seed_;
  }